

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

QObject * qt_qFindChild_helper
                    (QObject *parent,QAnyStringView name,QMetaObject *mo,FindChildOptions options)

{
  QObjectData *pQVar1;
  long lVar2;
  QObject **ppQVar3;
  _func_int **pp_Var4;
  bool bVar5;
  QObject *pQVar6;
  QObject *pQVar7;
  long lVar8;
  QAnyStringView lhs;
  
  pQVar1 = (parent->d_ptr).d;
  lVar2 = (pQVar1->children).d.size;
  if (lVar2 != 0) {
    ppQVar3 = (pQVar1->children).d.ptr;
    lVar8 = 0;
    do {
      pQVar7 = *(QObject **)((long)ppQVar3 + lVar8);
      pQVar6 = QMetaObject::cast(mo,pQVar7);
      if (pQVar6 != (QObject *)0x0) {
        if (name.field_0.m_data == (void *)0x0) {
          return pQVar7;
        }
        pp_Var4 = (pQVar7->d_ptr).d[1]._vptr_QObjectData;
        if (pp_Var4 == (_func_int **)0x0) {
          if (((undefined1  [16])name & (undefined1  [16])0x3fffffffffffffff) ==
              (undefined1  [16])0x0) {
            return pQVar7;
          }
        }
        else {
          lhs.m_size = (ulong)pp_Var4[0xe] | 0x8000000000000000;
          lhs.field_0.m_data =
               ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(pp_Var4 + 0xd))->m_data;
          bVar5 = QAnyStringView::equal(lhs,name);
          if (bVar5) {
            return pQVar7;
          }
        }
      }
      lVar8 = lVar8 + 8;
    } while (lVar2 << 3 != lVar8);
  }
  if (((uint)options.super_QFlagsStorageHelper<Qt::FindChildOption,_4>.
             super_QFlagsStorage<Qt::FindChildOption>.i & 1) != 0) {
    pQVar1 = (parent->d_ptr).d;
    lVar2 = (pQVar1->children).d.size;
    if (lVar2 != 0) {
      ppQVar3 = (pQVar1->children).d.ptr;
      lVar8 = 0;
      do {
        pQVar7 = qt_qFindChild_helper(*(QObject **)((long)ppQVar3 + lVar8),name,mo,options);
        if (pQVar7 != (QObject *)0x0) {
          return pQVar7;
        }
        lVar8 = lVar8 + 8;
      } while (lVar2 << 3 != lVar8);
      return (QObject *)0x0;
    }
  }
  return (QObject *)0x0;
}

Assistant:

QObject *qt_qFindChild_helper(const QObject *parent, QAnyStringView name, const QMetaObject &mo, Qt::FindChildOptions options)
{
    Q_ASSERT(parent);
    for (QObject *obj : parent->children()) {
        if (mo.cast(obj) && (name.isNull() || matches_objectName_non_null(obj, name)))
           return obj;
    }
    if (options & Qt::FindChildrenRecursively) {
        for (QObject *child : parent->children()) {
            if (QObject *obj = qt_qFindChild_helper(child, name, mo, options))
                return obj;
        }
    }
    return nullptr;
}